

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_auxv.c
# Opt level: O3

link_map * get_vdso_from_auxv(void)

{
  link_map *plVar1;
  long lVar2;
  long lVar3;
  
  parse_auxv_contents();
  if (vdso_ehdr != (Elf64_Ehdr *)0x0) {
    plVar1 = ___throw_regex_error;
    if ((ulong)vdso_ehdr->e_phnum == 0) {
      lVar2 = 0;
    }
    else {
      lVar3 = 0;
      lVar2 = 0;
      do {
        if (*(int *)(vdso_ehdr->e_ident + lVar3 + vdso_ehdr->e_phoff) == 2) {
          lVar2 = *(long *)(vdso_ehdr->e_ident + lVar3 + vdso_ehdr->e_phoff + 0x10);
        }
        lVar3 = lVar3 + 0x38;
      } while ((ulong)vdso_ehdr->e_phnum * 0x38 - lVar3 != 0);
    }
    for (; plVar1 != (link_map *)0x0; plVar1 = plVar1->l_next) {
      if ((Elf64_Dyn *)(plVar1->l_addr + lVar2) == plVar1->l_ld) {
        return plVar1;
      }
    }
  }
  return (link_map *)0x0;
}

Assistant:

struct link_map *get_vdso_from_auxv() {
  struct link_map *m = NULL;

  ElfW(Phdr) *vdso_phdrs = NULL;
  ElfW(Half) vdso_phdr_num, p;
  ElfW(Addr) vdso_dynamic = 0;

  parse_auxv_contents();
  if (vdso_ehdr) {
    vdso_phdrs =
        (ElfW(Phdr) *)(vdso_ehdr->e_phoff + ((unsigned char *)vdso_ehdr));
    vdso_phdr_num = vdso_ehdr->e_phnum;

    for (p = 0; p < vdso_phdr_num; p++) {
      if (vdso_phdrs[p].p_type == PT_DYNAMIC) {
        vdso_dynamic = (ElfW(Addr))vdso_phdrs[p].p_vaddr;
      }
    }

    for (m = _r_debug.r_map; m; m = m->l_next) {
      if (m->l_addr + vdso_dynamic == (ElfW(Addr))m->l_ld) {
        return m;
      }
    }
  }
  return NULL;  // GCOVR_EXCL_LINE
}